

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O1

int get_big_cpu_data_cache_size(int level)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ulong uVar11;
  ulong uVar12;
  long lVar5;
  
  uVar1 = 0;
  iVar6 = 0;
  iVar7 = 0;
  auVar4 = _DAT_005ef360;
  do {
    uVar11 = g_cpu_affinity_mask_big.cpu_set.__bits[uVar1 >> 6];
    auVar9 = auVar4 & _DAT_005effe0;
    auVar10._8_4_ = auVar9._8_4_;
    auVar10._12_4_ = auVar9._12_4_;
    auVar10._0_8_ = auVar9._8_8_;
    auVar8._8_4_ = (int)uVar11;
    auVar8._0_8_ = uVar11;
    auVar8._12_4_ = (int)(uVar11 >> 0x20);
    uVar11 = 1L << auVar9._0_8_ & uVar11;
    uVar12 = 1L << auVar10._8_8_ & auVar8._8_8_;
    iVar6 = (iVar6 - (uint)((int)uVar11 == 0 && (int)(uVar11 >> 0x20) == 0)) + 1;
    iVar7 = (iVar7 - (uint)((int)uVar12 == 0 && (int)(uVar12 >> 0x20) == 0)) + 1;
    uVar1 = uVar1 + 2;
    lVar5 = auVar4._8_8_;
    auVar4._0_8_ = auVar4._0_8_ + 2;
    auVar4._8_8_ = lVar5 + 2;
  } while (uVar1 != 0x400);
  uVar3 = iVar7 + iVar6;
  uVar1 = (ulong)uVar3;
  if (uVar3 != 0) {
    uVar11 = (ulong)g_cpucount;
    bVar2 = 0 < (long)uVar11;
    if (0 < (long)uVar11) {
      uVar12 = 0;
      do {
        if ((uVar12 < 0x400) &&
           (uVar1 = g_cpu_affinity_mask_big.cpu_set.__bits[uVar12 >> 6],
           (uVar1 >> (uVar12 & 0x3f) & 1) != 0)) {
          uVar3 = get_data_cache_size((int)uVar12,level);
          break;
        }
        uVar3 = (uint)uVar1;
        uVar12 = uVar12 + 1;
        bVar2 = uVar12 < uVar11;
      } while (uVar12 != uVar11);
    }
    if (bVar2) {
      return uVar3;
    }
  }
  iVar6 = get_data_cache_size(0,level);
  return iVar6;
}

Assistant:

static int get_big_cpu_data_cache_size(int level)
{
    if (g_cpu_affinity_mask_big.num_enabled() == 0)
    {
        // smp cpu
        return get_data_cache_size(0, level);
    }

    for (int i = 0; i < g_cpucount; i++)
    {
        if (g_cpu_affinity_mask_big.is_enabled(i))
        {
            return get_data_cache_size(i, level);
        }
    }

    // should never reach here, fallback to cpu0
    return get_data_cache_size(0, level);
}